

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

size_t __thiscall caffe::NetParameter::ByteSizeLong(NetParameter *this)

{
  void *pvVar1;
  size_type sVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Type *this_00;
  size_t sVar6;
  Type *pTVar7;
  Type *this_01;
  Type *this_02;
  size_t sVar8;
  uint uVar9;
  int n;
  long lVar10;
  
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    sVar6 = 0;
  }
  else {
    sVar6 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  uVar5 = (this->layers_).super_RepeatedPtrFieldBase.current_size_;
  lVar10 = sVar6 + uVar5;
  if ((ulong)uVar5 != 0) {
    uVar9 = 0;
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                          (&(this->layers_).super_RepeatedPtrFieldBase,uVar9);
      sVar6 = V1LayerParameter::ByteSizeLong(this_00);
      uVar4 = (uint)sVar6 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar10 = lVar10 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  uVar5 = (this->input_).super_RepeatedPtrFieldBase.current_size_;
  lVar10 = lVar10 + (ulong)uVar5;
  if (0 < (int)uVar5) {
    uVar9 = 0;
    do {
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->input_).super_RepeatedPtrFieldBase,uVar9);
      uVar4 = (uint)pTVar7->_M_string_length | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar10 = lVar10 + pTVar7->_M_string_length + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  sVar6 = google::protobuf::internal::WireFormatLite::Int32Size(&this->input_dim_);
  uVar5 = (this->input_shape_).super_RepeatedPtrFieldBase.current_size_;
  lVar10 = (uint)(this->input_dim_).current_size_ + sVar6 + (ulong)uVar5 + lVar10;
  if ((ulong)uVar5 != 0) {
    uVar9 = 0;
    do {
      this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
                          (&(this->input_shape_).super_RepeatedPtrFieldBase,uVar9);
      sVar6 = BlobShape::ByteSizeLong(this_01);
      uVar4 = (uint)sVar6 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar10 = lVar10 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  uVar5 = (this->layer_).super_RepeatedPtrFieldBase.current_size_;
  sVar6 = lVar10 + (ulong)uVar5 * 2;
  if ((ulong)uVar5 != 0) {
    uVar9 = 0;
    do {
      this_02 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                          (&(this->layer_).super_RepeatedPtrFieldBase,uVar9);
      sVar8 = LayerParameter::ByteSizeLong(this_02);
      uVar4 = (uint)sVar8 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar8 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  uVar5 = (this->_has_bits_).has_bits_[0];
  if ((uVar5 & 0xf) != 0) {
    if ((uVar5 & 1) != 0) {
      sVar2 = ((this->name_).ptr_)->_M_string_length;
      uVar9 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 2) != 0) {
      sVar8 = NetState::ByteSizeLong(this->state_);
      uVar5 = (uint)sVar8 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar8 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    uVar5 = (this->_has_bits_).has_bits_[0];
    sVar6 = sVar6 + (ulong)(uVar5 >> 2 & 2) + (ulong)(uVar5 >> 1 & 2);
  }
  this->_cached_size_ = (int)sVar6;
  return sVar6;
}

Assistant:

size_t NetParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.NetParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .caffe.V1LayerParameter layers = 2;
  {
    unsigned int count = this->layers_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->layers(i));
    }
  }

  // repeated string input = 3;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->input_size());
  for (int i = 0, n = this->input_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->input(i));
  }

  // repeated int32 input_dim = 4;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int32Size(this->input_dim_);
    total_size += 1 *
                  ::google::protobuf::internal::FromIntSize(this->input_dim_size());
    total_size += data_size;
  }

  // repeated .caffe.BlobShape input_shape = 8;
  {
    unsigned int count = this->input_shape_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->input_shape(i));
    }
  }

  // repeated .caffe.LayerParameter layer = 100;
  {
    unsigned int count = this->layer_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->layer(i));
    }
  }

  if (_has_bits_[0 / 32] & 15u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional .caffe.NetState state = 6;
    if (has_state()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->state_);
    }

    // optional bool force_backward = 5 [default = false];
    if (has_force_backward()) {
      total_size += 1 + 1;
    }

    // optional bool debug_info = 7 [default = false];
    if (has_debug_info()) {
      total_size += 1 + 1;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}